

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::event_type::event_type(event_type *this,listener_type *default_listener)

{
  function<bool_(void_*)> *in_stack_00000018;
  stack_type<std::function<bool_(void_*)>,_std::allocator> *in_stack_00000020;
  stack_type<std::function<bool_(void_*)>,_std::allocator> *in_stack_ffffffffffffffe0;
  
  stack_type<std::function<bool_(void_*)>,_std::allocator>::stack_type(in_stack_ffffffffffffffe0);
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            (in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

explicit event_type(listener_type default_listener)
		{
			m_listener.push(std::move(default_listener));
		}